

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

bool __thiscall leveldb::Compaction::ShouldStopBefore(Compaction *this,Slice *internal_key)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  InternalKeyComparator *pIVar4;
  VersionSet *pVVar5;
  int iVar6;
  size_type sVar7;
  reference ppFVar8;
  int64_t iVar9;
  Slice local_40;
  InternalKeyComparator *local_30;
  InternalKeyComparator *icmp;
  VersionSet *vset;
  Slice *internal_key_local;
  Compaction *this_local;
  
  icmp = (InternalKeyComparator *)this->input_version_->vset_;
  local_30 = &((VersionSet *)icmp)->icmp_;
  vset = (VersionSet *)internal_key;
  internal_key_local = (Slice *)this;
  while( true ) {
    uVar1 = this->grandparent_index_;
    sVar7 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                      (&this->grandparents_);
    pVVar5 = vset;
    pIVar4 = local_30;
    bVar3 = false;
    if (uVar1 < sVar7) {
      ppFVar8 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                operator[](&this->grandparents_,this->grandparent_index_);
      local_40 = InternalKey::Encode(&(*ppFVar8)->largest);
      iVar6 = (*(pIVar4->super_Comparator)._vptr_Comparator[2])(pIVar4,pVVar5,&local_40);
      bVar3 = 0 < iVar6;
    }
    if (!bVar3) break;
    if ((this->seen_key_ & 1U) != 0) {
      ppFVar8 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                operator[](&this->grandparents_,this->grandparent_index_);
      this->overlapped_bytes_ = (*ppFVar8)->file_size + this->overlapped_bytes_;
    }
    this->grandparent_index_ = this->grandparent_index_ + 1;
  }
  this->seen_key_ = true;
  lVar2 = this->overlapped_bytes_;
  iVar9 = MaxGrandParentOverlapBytes((Options *)icmp[2].user_comparator_);
  bVar3 = iVar9 < lVar2;
  if (bVar3) {
    this->overlapped_bytes_ = 0;
  }
  return bVar3;
}

Assistant:

bool Compaction::ShouldStopBefore(const Slice& internal_key) {
  const VersionSet* vset = input_version_->vset_;
  // Scan to find earliest grandparent file that contains key.
  const InternalKeyComparator* icmp = &vset->icmp_;
  while (grandparent_index_ < grandparents_.size() &&
         icmp->Compare(internal_key,
                       grandparents_[grandparent_index_]->largest.Encode()) >
             0) {
    if (seen_key_) {
      overlapped_bytes_ += grandparents_[grandparent_index_]->file_size;
    }
    grandparent_index_++;
  }
  seen_key_ = true;

  if (overlapped_bytes_ > MaxGrandParentOverlapBytes(vset->options_)) {
    // Too much overlap for current output; start new output
    overlapped_bytes_ = 0;
    return true;
  } else {
    return false;
  }
}